

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_scientific.cpp
# Opt level: O2

int32_t __thiscall
icu_63::number::impl::ScientificHandler::getMultiplier(ScientificHandler *this,int32_t magnitude)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  
  cVar1 = this->fSettings->fEngineeringInterval;
  iVar3 = (int)cVar1;
  if (this->fSettings->fRequireMinInt == false) {
    if (cVar1 < '\x02') {
      iVar3 = 1;
    }
    else {
      uVar2 = magnitude % iVar3 + iVar3;
      iVar3 = (short)((int)((uint)(ushort)((short)uVar2 >> 0xf) << 0x10 | uVar2 & 0xffff) %
                     (int)(short)cVar1) + 1;
    }
  }
  return ~magnitude + iVar3;
}

Assistant:

int32_t ScientificHandler::getMultiplier(int32_t magnitude) const {
    int32_t interval = fSettings.fEngineeringInterval;
    int32_t digitsShown;
    if (fSettings.fRequireMinInt) {
        // For patterns like "000.00E0" and ".00E0"
        digitsShown = interval;
    } else if (interval <= 1) {
        // For patterns like "0.00E0" and "@@@E0"
        digitsShown = 1;
    } else {
        // For patterns like "##0.00"
        digitsShown = ((magnitude % interval + interval) % interval) + 1;
    }
    return digitsShown - magnitude - 1;
}